

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.hpp
# Opt level: O2

void __thiscall cs::structure::structure(structure *this,structure *s)

{
  domain_type *pdVar1;
  element_type *peVar2;
  ctrl_t *pcVar3;
  size_t sVar4;
  proxy *ppVar5;
  size_type sVar6;
  bool bVar7;
  var *pvVar8;
  var *pvVar9;
  var p;
  const_iterator __begin3;
  any local_c0;
  allocator local_b1;
  domain_t *local_b0;
  string local_a8;
  var *local_88;
  structure *local_80;
  any local_78;
  any local_70;
  structure *local_68;
  structure *local_60;
  proxy *local_58;
  string *local_50;
  any local_48;
  any local_40;
  structure *local_38;
  
  this->m_shadow = false;
  std::__cxx11::string::string((string *)&this->m_name,(string *)&s->m_name);
  local_b0 = &this->m_data;
  std::make_shared<cs::domain_type>();
  sVar4 = (s->m_id).type_hash;
  (this->m_id).type_idx._M_target = (s->m_id).type_idx._M_target;
  (this->m_id).type_hash = sVar4;
  pdVar1 = (s->m_data).super___shared_ptr<cs::domain_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_50 = &this->m_name;
  std::__cxx11::string::string((string *)&local_a8,"parent",(allocator *)&local_c0);
  bVar7 = domain_type::exist(pdVar1,&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  if (bVar7) {
    pdVar1 = (s->m_data).super___shared_ptr<cs::domain_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::__cxx11::string::string((string *)&local_a8,"parent",(allocator *)&local_c0);
    pvVar8 = domain_type::get_var(pdVar1,&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
    local_80 = cs_impl::any::val<cs::structure>(pvVar8);
    local_40.mDat = pvVar8->mDat;
    if (local_40.mDat != (proxy *)0x0) {
      (local_40.mDat)->refcount = (local_40.mDat)->refcount + 1;
    }
    copy((EVP_PKEY_CTX *)&local_c0,(EVP_PKEY_CTX *)&local_40);
    cs_impl::any::recycle(&local_40);
    local_60 = cs_impl::any::val<cs::structure>(&local_c0);
    pdVar1 = (local_b0->super___shared_ptr<cs::domain_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    std::__cxx11::string::string((string *)&local_a8,"parent",(allocator *)&local_68);
    domain_type::add_var(pdVar1,&local_a8,&local_c0);
    local_88 = &local_c0;
    std::__cxx11::string::~string((string *)&local_a8);
    peVar2 = (local_60->m_data).super___shared_ptr<cs::domain_type,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    local_a8._0_16_ =
         phmap::priv::
         raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
         ::begin((raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                  *)peVar2);
    pcVar3 = (peVar2->m_reflect).
             super_raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
             .
             super_raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
             .ctrl_;
    sVar4 = (peVar2->m_reflect).
            super_raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
            .
            super_raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
            .capacity_;
    while (local_a8._M_dataplus._M_p != pcVar3 + sVar4) {
      sVar6 = local_a8._M_string_length;
      pvVar8 = domain_type::get_var
                         ((s->m_data).
                          super___shared_ptr<cs::domain_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                          (string *)local_a8._M_string_length);
      pvVar9 = domain_type::get_var
                         ((local_80->m_data).
                          super___shared_ptr<cs::domain_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                          (string *)sVar6);
      ppVar5 = pvVar8->mDat;
      pdVar1 = (local_b0->super___shared_ptr<cs::domain_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      if (pvVar9->mDat == ppVar5) {
        domain_type::add_var
                  (pdVar1,(string *)sVar6,
                   (((local_60->m_data).
                     super___shared_ptr<cs::domain_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->m_slot
                   ).super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl.
                   super__Vector_impl_data._M_start + *(long *)(sVar6 + 0x20));
      }
      else {
        if (ppVar5 != (proxy *)0x0) {
          ppVar5->refcount = ppVar5->refcount + 1;
        }
        local_70.mDat = ppVar5;
        copy((EVP_PKEY_CTX *)&local_68,(EVP_PKEY_CTX *)&local_70);
        domain_type::add_var(pdVar1,(string *)sVar6,(var *)&local_68);
        cs_impl::any::recycle((any *)&local_68);
        cs_impl::any::recycle(&local_70);
      }
      phmap::priv::
      raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
      ::iterator::operator++((iterator *)&local_a8);
    }
    cs_impl::any::recycle(&local_c0);
  }
  peVar2 = (s->m_data).super___shared_ptr<cs::domain_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_80 = s;
  local_a8._0_16_ =
       phmap::priv::
       raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
       ::begin((raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                *)peVar2);
  pcVar3 = (peVar2->m_reflect).
           super_raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
           .
           super_raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
           .ctrl_;
  sVar4 = (peVar2->m_reflect).
          super_raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
          .
          super_raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
          .capacity_;
  while (local_a8._M_dataplus._M_p != pcVar3 + sVar4) {
    sVar6 = local_a8._M_string_length;
    bVar7 = domain_type::exist((local_b0->
                               super___shared_ptr<cs::domain_type,_(__gnu_cxx::_Lock_policy)2>).
                               _M_ptr,(string *)local_a8._M_string_length);
    if (!bVar7) {
      pdVar1 = (local_b0->super___shared_ptr<cs::domain_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      local_58 = (((local_80->m_data).
                   super___shared_ptr<cs::domain_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->m_slot).
                 super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl.
                 super__Vector_impl_data._M_start[*(long *)(sVar6 + 0x20)].mDat;
      if (local_58 != (proxy *)0x0) {
        local_58->refcount = local_58->refcount + 1;
      }
      copy((EVP_PKEY_CTX *)&local_c0,(EVP_PKEY_CTX *)&local_58);
      domain_type::add_var(pdVar1,(string *)sVar6,(var *)&local_c0);
      cs_impl::any::recycle(&local_c0);
      cs_impl::any::recycle((any *)&local_58);
    }
    phmap::priv::
    raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
    ::iterator::operator++((iterator *)&local_a8);
  }
  pdVar1 = (local_b0->super___shared_ptr<cs::domain_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  std::__cxx11::string::string((string *)&local_a8,"duplicate",(allocator *)&local_c0);
  bVar7 = domain_type::exist(pdVar1,&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  local_38 = local_80;
  if (bVar7) {
    pdVar1 = (local_b0->super___shared_ptr<cs::domain_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    std::__cxx11::string::string((string *)&local_a8,"duplicate",&local_b1);
    pvVar8 = domain_type::get_var(pdVar1,&local_a8);
    local_68 = this;
    cs_impl::any::make<cs::structure,cs::structure*>(&local_c0,&local_68);
    cs_impl::any::make<cs::structure,cs::structure_const*>(&local_78,&local_38);
    invoke<cs_impl::any,cs_impl::any>((cs *)&local_48,pvVar8,&local_c0,&local_78);
    cs_impl::any::recycle(&local_48);
    cs_impl::any::recycle(&local_78);
    cs_impl::any::recycle(&local_c0);
    std::__cxx11::string::~string((string *)&local_a8);
  }
  return;
}

Assistant:

structure(const structure &s) : m_id(s.m_id), m_name(s.m_name),
			m_data(std::make_shared<domain_type>())
		{
			if (s.m_data->exist("parent")) {
				var &_p = s.m_data->get_var("parent");
				auto &_parent = _p.val<structure>();
				var p = copy(_p);
				auto &parent = p.val<structure>();
				m_data->add_var("parent", p);
				for (auto &it: *parent.m_data) {
					// Handle overriding
					const var &v = s.m_data->get_var(it.first);
					if (!_parent.m_data->get_var(it.first).is_same(v))
						m_data->add_var(it.first, copy(v));
					else
						m_data->add_var(it.first, parent.m_data->get_var_by_id(it.second));
				}
			}
			for (auto &it: *s.m_data)
				if (!m_data->exist(it.first))
					m_data->add_var(it.first, copy(s.m_data->get_var_by_id(it.second)));
			if (m_data->exist("duplicate"))
				invoke(m_data->get_var("duplicate"), var::make<structure>(this), var::make<structure>(&s));
		}